

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void check_nms_dl_il_sl_tl_l2c(DisasContext_conflict6 *ctx)

{
  bool bVar1;
  DisasContext_conflict6 *ctx_local;
  
  bVar1 = false;
  if (((((ctx->CP0_Config5 & 0x200000U) != 0) && (bVar1 = false, (ctx->CP0_Config1 & 0x400U) == 0))
      && (bVar1 = false, (ctx->CP0_Config1 & 0x80000U) == 0)) &&
     ((bVar1 = false, (ctx->CP0_Config2 & 0x10U) == 0 &&
      (bVar1 = false, (ctx->CP0_Config2 & 0x100000U) == 0)))) {
    bVar1 = (ctx->CP0_Config5 & 0x400U) == 0;
  }
  if (bVar1) {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static inline void check_nms_dl_il_sl_tl_l2c(DisasContext *ctx)
{
    if (unlikely((ctx->CP0_Config5 & (1 << CP0C5_NMS)) &&
                 !(ctx->CP0_Config1 & (1 << CP0C1_DL)) &&
                 !(ctx->CP0_Config1 & (1 << CP0C1_IL)) &&
                 !(ctx->CP0_Config2 & (1 << CP0C2_SL)) &&
                 !(ctx->CP0_Config2 & (1 << CP0C2_TL)) &&
                 !(ctx->CP0_Config5 & (1 << CP0C5_L2C)))) {
        generate_exception_end(ctx, EXCP_RI);
    }
}